

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evpath_dp.c
# Opt level: O3

void EvpathReleaseTimestep(CP_Services Svcs,DP_WS_Stream Stream_v,size_t Timestep)

{
  void *pvVar1;
  void *pvVar2;
  undefined8 *puVar3;
  size_t *psVar4;
  size_t *__ptr;
  
  (*Svcs->verbose)(*(void **)((long)Stream_v + 8),4,"Releasing timestep %ld\n",Timestep);
  pthread_mutex_lock((pthread_mutex_t *)((long)Stream_v + 0x18));
  __ptr = *(size_t **)((long)Stream_v + 0x40);
  if ((__ptr == (size_t *)0x0) || (*__ptr != Timestep)) {
    do {
      psVar4 = __ptr;
      __ptr = (size_t *)psVar4[5];
      if (__ptr == (size_t *)0x0) {
        fprintf(_stderr,"Failed to release Timestep %zd, not found\n",Timestep);
        goto LAB_00729e8c;
      }
    } while (*__ptr != Timestep);
    psVar4[5] = __ptr[5];
    puVar3 = (undefined8 *)__ptr[3];
    if (puVar3 != (undefined8 *)0x0) {
      if ((void *)*puVar3 != (void *)0x0) {
        free((void *)*puVar3);
        puVar3 = (undefined8 *)__ptr[3];
        if (puVar3 == (undefined8 *)0x0) goto LAB_00729e59;
      }
      free(puVar3);
    }
LAB_00729e59:
    pvVar2 = (void *)__ptr[4];
    while (pvVar2 != (void *)0x0) {
      pvVar1 = *(void **)((long)pvVar2 + 0x10);
      if (*(void **)((long)pvVar2 + 8) != (void *)0x0) {
        free(*(void **)((long)pvVar2 + 8));
      }
      free(pvVar2);
      pvVar2 = pvVar1;
    }
    goto LAB_00729e84;
  }
  *(size_t *)((long)Stream_v + 0x40) = __ptr[5];
  puVar3 = (undefined8 *)__ptr[3];
  if (puVar3 != (undefined8 *)0x0) {
    if ((void *)*puVar3 != (void *)0x0) {
      free((void *)*puVar3);
      puVar3 = (undefined8 *)__ptr[3];
      if (puVar3 == (undefined8 *)0x0) goto LAB_00729de8;
    }
    free(puVar3);
  }
LAB_00729de8:
  pvVar2 = (void *)__ptr[4];
  while (pvVar2 != (void *)0x0) {
    pvVar1 = *(void **)((long)pvVar2 + 0x10);
    if (*(void **)((long)pvVar2 + 8) != (void *)0x0) {
      free(*(void **)((long)pvVar2 + 8));
    }
    free(pvVar2);
    pvVar2 = pvVar1;
  }
LAB_00729e84:
  free(__ptr);
LAB_00729e8c:
  pthread_mutex_unlock((pthread_mutex_t *)((long)Stream_v + 0x18));
  return;
}

Assistant:

static void EvpathReleaseTimestep(CP_Services Svcs, DP_WS_Stream Stream_v, size_t Timestep)
{
    Evpath_WS_Stream WS_Stream = (Evpath_WS_Stream)Stream_v;
    TimestepList List;

    Svcs->verbose(WS_Stream->CP_Stream, DPPerRankVerbose, "Releasing timestep %ld\n", Timestep);
    pthread_mutex_lock(&WS_Stream->DataLock);
    List = WS_Stream->Timesteps;
    if (WS_Stream->Timesteps && (WS_Stream->Timesteps->Timestep == Timestep))
    {
        WS_Stream->Timesteps = List->Next;
        if (List->DP_TimestepInfo && List->DP_TimestepInfo->CheckString)
            free(List->DP_TimestepInfo->CheckString);
        if (List->DP_TimestepInfo)
            free(List->DP_TimestepInfo);
        if (List->ReaderRequests)
        {
            ReaderRequestTrackPtr tmp = List->ReaderRequests;
            while (tmp)
            {
                ReaderRequestTrackPtr Next = tmp->Next;
                if (tmp->RequestList)
                    free(tmp->RequestList);
                free(tmp);
                tmp = Next;
            }
        }

        free(List);
    }
    else
    {
        TimestepList last = List;
        List = List->Next;
        while (List != NULL)
        {
            if (List->Timestep == Timestep)
            {
                last->Next = List->Next;
                if (List->DP_TimestepInfo && List->DP_TimestepInfo->CheckString)
                    free(List->DP_TimestepInfo->CheckString);
                if (List->DP_TimestepInfo)
                    free(List->DP_TimestepInfo);
                if (List->ReaderRequests)
                {
                    ReaderRequestTrackPtr tmp = List->ReaderRequests;
                    while (tmp)
                    {
                        ReaderRequestTrackPtr Next = tmp->Next;
                        if (tmp->RequestList)
                            free(tmp->RequestList);
                        free(tmp);
                        tmp = Next;
                    }
                }

                free(List);
                pthread_mutex_unlock(&WS_Stream->DataLock);
                return;
            }
            last = List;
            List = List->Next;
        }
        /*
         * Shouldn't ever get here because we should never release a
         * timestep that we don't have.
         */
        fprintf(stderr, "Failed to release Timestep %zd, not found\n", Timestep);
        assert(0);
    }
    pthread_mutex_unlock(&WS_Stream->DataLock);
}